

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

void density_tests::detail::
     lf_queues_generic_tests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
               (TestSettings *i_settings,QueueTesterFlags i_flags,ostream *i_output,
               EasyRandom *i_random,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *i_nonblocking_thread_counts)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *this;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  bVar2 = TestSettings::should_run(i_settings,"page_def");
  bVar3 = TestSettings::should_run(i_settings,"page_256");
  if ((i_flags & eUseTestAllocators) == eNone) {
    if (!bVar2) {
      return;
    }
    sVar1 = i_settings->m_queue_tests_cardinality;
    this = &local_a8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
               i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
              (i_flags,i_output,i_random,sVar1,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  }
  else {
    if (bVar2) {
      sVar1 = i_settings->m_queue_tests_cardinality;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
                 i_nonblocking_thread_counts);
      single_lf_queue_generic_test<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
                (i_flags,i_output,i_random,sVar1,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
      sVar1 = i_settings->m_queue_tests_cardinality;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
                 i_nonblocking_thread_counts);
      single_lf_queue_generic_test<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
                (i_flags,i_output,i_random,sVar1,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
    }
    if (!bVar3) {
      return;
    }
    sVar1 = i_settings->m_queue_tests_cardinality;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
               i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
              (i_flags,i_output,i_random,sVar1,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
    sVar1 = i_settings->m_queue_tests_cardinality;
    this = &local_90;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
               i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
              (i_flags,i_output,i_random,sVar1,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(this);
  return;
}

Assistant:

void lf_queues_generic_tests(
          const TestSettings &        i_settings,
          QueueTesterFlags            i_flags,
          std::ostream &              i_output,
          EasyRandom &                i_random,
          std::vector<size_t> const & i_nonblocking_thread_counts)
        {
            using namespace density;

            bool const run_page_default = i_settings.should_run("page_def");
            bool const run_page_256     = i_settings.should_run("page_256");

            if (i_flags && QueueTesterFlags::eUseTestAllocators)
            {
                if (run_page_default)
                {
                    single_lf_queue_generic_test<lf_heter_queue<
                      runtime_type<>,
                      UnmovableFastTestAllocator<>,
                      PROD_CARDINALITY,
                      CONSUMER_CARDINALITY,
                      CONSISTENCY_MODEL>>(
                      i_flags,
                      i_output,
                      i_random,
                      i_settings.m_queue_tests_cardinality,
                      i_nonblocking_thread_counts);

                    single_lf_queue_generic_test<lf_heter_queue<
                      TestRuntimeTime<>,
                      DeepTestAllocator<>,
                      PROD_CARDINALITY,
                      CONSUMER_CARDINALITY,
                      CONSISTENCY_MODEL>>(
                      i_flags,
                      i_output,
                      i_random,
                      i_settings.m_queue_tests_cardinality,
                      i_nonblocking_thread_counts);
                }
                if (run_page_256)
                {
                    single_lf_queue_generic_test<lf_heter_queue<
                      runtime_type<>,
                      UnmovableFastTestAllocator<256>,
                      PROD_CARDINALITY,
                      CONSUMER_CARDINALITY,
                      CONSISTENCY_MODEL>>(
                      i_flags,
                      i_output,
                      i_random,
                      i_settings.m_queue_tests_cardinality,
                      i_nonblocking_thread_counts);

                    single_lf_queue_generic_test<lf_heter_queue<
                      TestRuntimeTime<>,
                      DeepTestAllocator<256>,
                      PROD_CARDINALITY,
                      CONSUMER_CARDINALITY,
                      CONSISTENCY_MODEL>>(
                      i_flags,
                      i_output,
                      i_random,
                      i_settings.m_queue_tests_cardinality,
                      i_nonblocking_thread_counts);
                }
            }
            else
            {
                if (run_page_default)
                {
                    single_lf_queue_generic_test<lf_heter_queue<
                      runtime_type<>,
                      default_allocator,
                      PROD_CARDINALITY,
                      CONSUMER_CARDINALITY,
                      CONSISTENCY_MODEL>>(
                      i_flags,
                      i_output,
                      i_random,
                      i_settings.m_queue_tests_cardinality,
                      i_nonblocking_thread_counts);
                }
            }
        }